

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O2

void __thiscall CVmMemoryStream::write_bytes(CVmMemoryStream *this,char *buf,size_t len)

{
  if (len <= this->buf_ + (this->buflen_ - (long)this->p_)) {
    memcpy(this->p_,buf,len);
    this->p_ = this->p_ + len;
    return;
  }
  err_throw(0x66);
}

Assistant:

void write_bytes(const char *buf, size_t len)
    {
        /* if we don't have space, throw an error */
        if (len > (size_t)((buf_ + buflen_) - p_))
            err_throw(VMERR_WRITE_FILE);

        /* copy the data */
        memcpy(p_, buf, len);

        /* advance past the data */
        p_ += len;
    }